

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O3

int speakers_within_set(int set,vbap_data *data)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  
  compute_set_matrix_3d(set,data);
  uVar3 = (ulong)data->speaker_count;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    bVar4 = true;
    uVar5 = 0;
    do {
      if (((uVar5 != data->sets[set].speakers[0]) && (uVar5 != data->sets[set].speakers[1])) &&
         (uVar5 != data->sets[set].speakers[2])) {
        bVar1 = true;
        lVar6 = 0;
        do {
          if (*(float *)((long)data->sets[set].inv_mat + lVar6 + 8) * data->speakers[uVar5][2] +
              *(float *)((long)data->sets[set].inv_mat + lVar6) * data->speakers[uVar5][0] +
              *(float *)((long)data->sets[set].inv_mat + lVar6 + 4) * data->speakers[uVar5][1] <
              -0.001) {
            bVar1 = false;
          }
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x24);
        if (bVar1) break;
      }
      uVar5 = uVar5 + 1;
      bVar4 = uVar5 < uVar3;
    } while (uVar5 != uVar3);
    uVar2 = (uint)bVar4;
  }
  return uVar2;
}

Assistant:

int speakers_within_set(int set, struct vbap_data *data){
  compute_set_matrix_3d(set, data);
  float *inv_mat = data->sets[set].inv_mat;
  int i = data->sets[set].speakers[0];
  int j = data->sets[set].speakers[1];
  int k = data->sets[set].speakers[2];
  for(int s=0; s<data->speaker_count; ++s){
    if(s != i && s != j && s != k){
      float *sp = data->speakers[s];
      char inside = 1;
      for(int t=0; t<3; ++t){
        float tmp = sp[0] * inv_mat[0 + t*3] +
                    sp[1] * inv_mat[1 + t*3] +
                    sp[2] * inv_mat[2 + t*3];
        if(tmp < -0.001) inside = 0;
      }
      if(inside) return 1;
    }
  }
  return 0;
}